

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

void __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *b,size_t id)

{
  iterator __position;
  unsigned_long uVar1;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *ppVar2;
  size_t local_8;
  
  ppVar2 = (this->borderBuckets).
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->borderBuckets).
       super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar1 = 0xffffffffffffffff;
  if (ppVar2 != __position._M_current) {
    do {
      if (((ppVar2->second)._M_data)->id == b->id) {
        uVar1 = ppVar2->first;
        break;
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != __position._M_current);
  }
  if (uVar1 != id) {
    if (__position._M_current ==
        (this->borderBuckets).
        super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_8 = id;
      std::
      vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
      ::_M_realloc_insert<unsigned_long&,dg::vr::Bucket_const&>
                ((vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
                  *)&this->borderBuckets,__position,&local_8,b);
    }
    else {
      (__position._M_current)->first = id;
      ((__position._M_current)->second)._M_data = b;
      (this->borderBuckets).
      super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void makeBorderBucket(const Bucket &b, size_t id) {
        size_t currentId = getBorderId(b);
        if (currentId == id)
            return;

        assert(getBorderB(id) == nullptr);
        assert(getBorderId(b) == std::string::npos);
        borderBuckets.emplace_back(id, b);
    }